

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O2

void Io_NtkWriteSubcktFanins(FILE *pFile,Abc_Obj_t *pNode)

{
  void **ppvVar1;
  char *pcVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
  fprintf((FILE *)pFile," m%d",(ulong)(uint)pNode->Id);
  iVar5 = 6;
  lVar7 = 0;
  iVar4 = 0;
  do {
    ppvVar1 = pNode->pNtk->vObjs->pArray;
    if ((pNode->vFanins).nSize <= lVar7) {
      pcVar2 = Abc_ObjName((Abc_Obj_t *)ppvVar1[*(pNode->vFanouts).pArray]);
      if (iVar4 != 0) {
        sVar3 = strlen(pcVar2);
        if (0x4b < (int)sVar3 + iVar5 + 3) {
          fwrite(" \\\n",3,1,(FILE *)pFile);
        }
      }
      fprintf((FILE *)pFile," %c=%s",0x6f,pcVar2);
      return;
    }
    pcVar2 = Abc_ObjName((Abc_Obj_t *)ppvVar1[(pNode->vFanins).pArray[lVar7]]);
    sVar3 = strlen(pcVar2);
    iVar6 = (int)sVar3 + 3;
    if (iVar4 == 0) {
LAB_002e4476:
      iVar4 = 0;
    }
    else if (0x4b < iVar6 + iVar5) {
      fwrite(" \\\n",3,1,(FILE *)pFile);
      iVar5 = 0;
      goto LAB_002e4476;
    }
    fprintf((FILE *)pFile," %c=%s",(ulong)((int)lVar7 + 0x61),pcVar2);
    iVar5 = iVar5 + iVar6;
    iVar4 = iVar4 + 1;
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

void Io_NtkWriteSubcktFanins( FILE * pFile, Abc_Obj_t * pNode )
{
    Abc_Obj_t * pNet;
    int LineLength;
    int AddedLength;
    int NameCounter;
    char * pName;
    int i;

    LineLength  = 6;
    NameCounter = 0;

    // get the output name
    pName = Abc_ObjName(Abc_ObjFanout0(pNode));
    // get the line length after the output name is written
    AddedLength = strlen(pName) + 1;
    fprintf( pFile, " m%d", Abc_ObjId(pNode) );

    // get the input names
    Abc_ObjForEachFanin( pNode, pNet, i )
    {
        // get the fanin name
        pName = Abc_ObjName(pNet);
        // get the line length after the fanin name is written
        AddedLength = strlen(pName) + 3;
        if ( NameCounter && LineLength + AddedLength + 3 > IO_WRITE_LINE_LENGTH )
        { // write the line extender
            fprintf( pFile, " \\\n" );
            // reset the line length
            LineLength  = 0;
            NameCounter = 0;
        }
        fprintf( pFile, " %c=%s", 'a'+i, pName );
        LineLength += AddedLength;
        NameCounter++;
    }

    // get the output name
    pName = Abc_ObjName(Abc_ObjFanout0(pNode));
    // get the line length after the output name is written
    AddedLength = strlen(pName) + 3;
    if ( NameCounter && LineLength + AddedLength > 75 )
    { // write the line extender
        fprintf( pFile, " \\\n" );
        // reset the line length
        LineLength  = 0;
        NameCounter = 0;
    }
    fprintf( pFile, " %c=%s", 'o', pName );
}